

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O2

pair<mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>,_mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>_>
 __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>::equal_range
          (map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> *this,
          key_type *key)

{
  iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_> iVar1;
  pair<mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>,_mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>_>
  pVar2;
  compare_key_type compare_key;
  compare_key<tinyusdz::crate::CrateDataTypeId> local_1c;
  
  local_1c.key = *key;
  pVar2.first.pos =
       bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,bool>const*,mapbox::eternal::impl::compare_key<tinyusdz::crate::CrateDataTypeId>>
                 (this->data_,this[1].data_,&local_1c);
  iVar1.pos = bound<mapbox::eternal::impl::greater_equal,mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,bool>const*,mapbox::eternal::impl::compare_key<tinyusdz::crate::CrateDataTypeId>>
                        (pVar2.first.pos,this[1].data_,&local_1c);
  pVar2.second.pos = iVar1.pos;
  return pVar2;
}

Assistant:

constexpr compare_key(const Key& key_) noexcept : key(key_) {
    }